

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean_test.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_82a95::CleanTestCleanRule::Run(CleanTestCleanRule *this)

{
  State *state;
  VirtualFileSystem *this_00;
  DyndepLoader *pDVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Test *pTVar4;
  bool bVar5;
  int iVar6;
  TimeStamp TVar7;
  string err;
  Cleaner cleaner;
  string local_108;
  string local_e8;
  Cleaner local_c8;
  
  iVar6 = g_current_test->assertion_failures_;
  state = &(this->super_CleanTest).super_StateTestWithBuiltinRules.state_;
  AssertParse(state,
              "rule cat_e\n  command = cat -e $in > $out\nbuild in1: cat_e src1\nbuild out1: cat in1\nbuild in2: cat_e src2\nbuild out2: cat in2\n"
              ,(ManifestParserOptions)0x0);
  if (iVar6 == g_current_test->assertion_failures_) {
    pDVar1 = &local_c8.dyndep_loader_;
    local_c8.state_ = (State *)pDVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"in1","");
    paVar2 = &local_108.field_2;
    local_108._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
    this_00 = &(this->super_CleanTest).fs_;
    VirtualFileSystem::Create(this_00,(string *)&local_c8,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar2) {
      operator_delete(local_108._M_dataplus._M_p,
                      CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                               local_108.field_2._M_local_buf[0]) + 1);
    }
    if (local_c8.state_ != (State *)pDVar1) {
      operator_delete(local_c8.state_,
                      (ulong)((long)&((local_c8.dyndep_loader_.state_)->paths_)._M_h + 1));
    }
    local_c8.state_ = (State *)pDVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"out1","");
    local_108._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
    VirtualFileSystem::Create(this_00,(string *)&local_c8,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar2) {
      operator_delete(local_108._M_dataplus._M_p,
                      CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                               local_108.field_2._M_local_buf[0]) + 1);
    }
    if (local_c8.state_ != (State *)pDVar1) {
      operator_delete(local_c8.state_,
                      (ulong)((long)&((local_c8.dyndep_loader_.state_)->paths_)._M_h + 1));
    }
    local_c8.state_ = (State *)pDVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"in2","");
    local_108._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
    VirtualFileSystem::Create(this_00,(string *)&local_c8,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar2) {
      operator_delete(local_108._M_dataplus._M_p,
                      CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                               local_108.field_2._M_local_buf[0]) + 1);
    }
    if (local_c8.state_ != (State *)pDVar1) {
      operator_delete(local_c8.state_,
                      (ulong)((long)&((local_c8.dyndep_loader_.state_)->paths_)._M_h + 1));
    }
    local_c8.state_ = (State *)pDVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"out2","");
    local_108._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
    VirtualFileSystem::Create(this_00,(string *)&local_c8,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar2) {
      operator_delete(local_108._M_dataplus._M_p,
                      CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                               local_108.field_2._M_local_buf[0]) + 1);
    }
    if (local_c8.state_ != (State *)pDVar1) {
      operator_delete(local_c8.state_,
                      (ulong)((long)&((local_c8.dyndep_loader_.state_)->paths_)._M_h + 1));
    }
    Cleaner::Cleaner(&local_c8,state,&(this->super_CleanTest).config_,&this_00->super_DiskInterface)
    ;
    bVar5 = testing::Test::Check
                      (g_current_test,local_c8.cleaned_files_count_ == 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                       ,0xb4,"0 == cleaner.cleaned_files_count()");
    pTVar4 = g_current_test;
    if (bVar5) {
      iVar6 = Cleaner::CleanRule(&local_c8,"cat_e");
      bVar5 = testing::Test::Check
                        (pTVar4,iVar6 == 0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                         ,0xb5,"0 == cleaner.CleanRule(\"cat_e\")");
      if (bVar5) {
        testing::Test::Check
                  (g_current_test,local_c8.cleaned_files_count_ == 2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                   ,0xb6,"2 == cleaner.cleaned_files_count()");
        testing::Test::Check
                  (g_current_test,
                   (this->super_CleanTest).fs_.files_removed_._M_t._M_impl.super__Rb_tree_header.
                   _M_node_count == 2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                   ,0xb7,"2u == fs_.files_removed_.size()");
        pTVar4 = g_current_test;
        local_108._M_string_length = 0;
        local_108.field_2._M_local_buf[0] = '\0';
        paVar3 = &local_e8.field_2;
        local_108._M_dataplus._M_p = (pointer)paVar2;
        local_e8._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"in1","");
        TVar7 = VirtualFileSystem::Stat(this_00,&local_e8,&local_108);
        testing::Test::Check
                  (pTVar4,TVar7 == 0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                   ,0xbb,"0 == fs_.Stat(\"in1\", &err)");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != paVar3) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        pTVar4 = g_current_test;
        local_e8._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"out1","");
        TVar7 = VirtualFileSystem::Stat(this_00,&local_e8,&local_108);
        testing::Test::Check
                  (pTVar4,0 < TVar7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                   ,0xbc,"0 < fs_.Stat(\"out1\", &err)");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != paVar3) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        pTVar4 = g_current_test;
        local_e8._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"in2","");
        TVar7 = VirtualFileSystem::Stat(this_00,&local_e8,&local_108);
        testing::Test::Check
                  (pTVar4,TVar7 == 0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                   ,0xbd,"0 == fs_.Stat(\"in2\", &err)");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != paVar3) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        pTVar4 = g_current_test;
        local_e8._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"out2","");
        TVar7 = VirtualFileSystem::Stat(this_00,&local_e8,&local_108);
        testing::Test::Check
                  (pTVar4,0 < TVar7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                   ,0xbe,"0 < fs_.Stat(\"out2\", &err)");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != paVar3) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&(this->super_CleanTest).fs_.files_removed_._M_t);
        pTVar4 = g_current_test;
        iVar6 = Cleaner::CleanRule(&local_c8,"cat_e");
        bVar5 = testing::Test::Check
                          (pTVar4,iVar6 == 0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                           ,0xc1,"0 == cleaner.CleanRule(\"cat_e\")");
        if (bVar5) {
          testing::Test::Check
                    (g_current_test,local_c8.cleaned_files_count_ == 0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                     ,0xc2,"0 == cleaner.cleaned_files_count()");
          testing::Test::Check
                    (g_current_test,
                     (this->super_CleanTest).fs_.files_removed_._M_t._M_impl.super__Rb_tree_header.
                     _M_node_count == 0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean_test.cc"
                     ,0xc3,"0u == fs_.files_removed_.size()");
        }
        else {
          g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != paVar2) {
          operator_delete(local_108._M_dataplus._M_p,
                          CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                                   local_108.field_2._M_local_buf[0]) + 1);
        }
      }
      else {
        g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
      }
    }
    else {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
    std::
    _Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>::
    ~_Rb_tree(&local_c8.cleaned_._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_c8.removed_._M_t);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(CleanTest, CleanRule) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule cat_e\n"
"  command = cat -e $in > $out\n"
"build in1: cat_e src1\n"
"build out1: cat in1\n"
"build in2: cat_e src2\n"
"build out2: cat in2\n"));
  fs_.Create("in1", "");
  fs_.Create("out1", "");
  fs_.Create("in2", "");
  fs_.Create("out2", "");

  Cleaner cleaner(&state_, config_, &fs_);

  ASSERT_EQ(0, cleaner.cleaned_files_count());
  ASSERT_EQ(0, cleaner.CleanRule("cat_e"));
  EXPECT_EQ(2, cleaner.cleaned_files_count());
  EXPECT_EQ(2u, fs_.files_removed_.size());

  // Check they are removed.
  string err;
  EXPECT_EQ(0, fs_.Stat("in1", &err));
  EXPECT_LT(0, fs_.Stat("out1", &err));
  EXPECT_EQ(0, fs_.Stat("in2", &err));
  EXPECT_LT(0, fs_.Stat("out2", &err));
  fs_.files_removed_.clear();

  ASSERT_EQ(0, cleaner.CleanRule("cat_e"));
  EXPECT_EQ(0, cleaner.cleaned_files_count());
  EXPECT_EQ(0u, fs_.files_removed_.size());
}